

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_union_constructor(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  t_type *ptVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar5;
  char *pcVar6;
  pointer pptVar7;
  t_java_generator *this_00;
  string local_e0;
  ostream *local_c0;
  string local_b8;
  t_type *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"public ");
  type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
  poVar3 = std::operator<<(poVar3,(string *)&local_e0);
  poVar3 = std::operator<<(poVar3,"() {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_e0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pptVar7 ==
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"super();");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_001f990d:
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"}");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"public ");
      type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
      poVar3 = std::operator<<(poVar3,(string *)&local_e0);
      poVar3 = std::operator<<(poVar3,"(_Fields setField, java.lang.Object value) {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_e0);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"  super(setField, value);");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"}");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"public ");
      type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
      poVar3 = std::operator<<(poVar3,(string *)&local_e0);
      poVar3 = std::operator<<(poVar3,"(");
      type_name_abi_cxx11_(&local_b8,this,&tstruct->super_t_type,false,false,false,false);
      poVar3 = std::operator<<(poVar3,(string *)&local_b8);
      poVar3 = std::operator<<(poVar3," other) {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_e0);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"  super(other);");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"}");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"public ");
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
      poVar3 = std::operator<<(poVar3," deepCopy() {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"  return new ");
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
      poVar3 = std::operator<<(poVar3,"(this);");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      local_c0 = out;
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"}");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      for (pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar7 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
        ptVar4 = (*pptVar7)->type_;
        poVar3 = t_generator::indent((t_generator *)this,local_c0);
        poVar3 = std::operator<<(poVar3,"public static ");
        type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
        poVar3 = std::operator<<(poVar3,(string *)&local_e0);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = std::operator<<(poVar3,(string *)&(*pptVar7)->name_);
        poVar3 = std::operator<<(poVar3,"(");
        type_name_abi_cxx11_(&local_b8,this,ptVar4,false,false,false,false);
        poVar5 = std::operator<<(poVar3,(string *)&local_b8);
        poVar3 = local_c0;
        poVar5 = std::operator<<(poVar5," value) {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_e0);
        poVar5 = t_generator::indent((t_generator *)this,poVar3);
        poVar5 = std::operator<<(poVar5,"  ");
        type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
        poVar5 = std::operator<<(poVar5,(string *)&local_e0);
        poVar5 = std::operator<<(poVar5," x = new ");
        type_name_abi_cxx11_(&local_b8,this,&tstruct->super_t_type,false,false,false,false);
        local_98 = ptVar4;
        poVar5 = std::operator<<(poVar5,(string *)&local_b8);
        poVar5 = std::operator<<(poVar5,"();");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_e0);
        poVar3 = t_generator::indent((t_generator *)this,poVar3);
        poVar3 = std::operator<<(poVar3,"  x.set");
        std::__cxx11::string::string((string *)&local_70,(string *)&(*pptVar7)->name_);
        get_cap_name(&local_e0,this,&local_70);
        poVar3 = std::operator<<(poVar3,(string *)&local_e0);
        poVar3 = std::operator<<(poVar3,"(value);");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_70);
        poVar3 = local_c0;
        poVar5 = t_generator::indent((t_generator *)this,local_c0);
        poVar5 = std::operator<<(poVar5,"  return x;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        poVar5 = t_generator::indent((t_generator *)this,poVar3);
        poVar5 = std::operator<<(poVar5,"}");
        poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        iVar2 = (*(local_98->super_t_doc)._vptr_t_doc[7])();
        if ((char)iVar2 != '\0') {
          poVar5 = t_generator::indent((t_generator *)this,poVar3);
          poVar5 = std::operator<<(poVar5,"public static ");
          type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
          poVar5 = std::operator<<(poVar5,(string *)&local_e0);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
          poVar5 = std::operator<<(poVar5,"(byte[] value) {");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_e0);
          poVar5 = t_generator::indent((t_generator *)this,poVar3);
          poVar5 = std::operator<<(poVar5,"  ");
          type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
          poVar5 = std::operator<<(poVar5,(string *)&local_e0);
          poVar5 = std::operator<<(poVar5," x = new ");
          type_name_abi_cxx11_(&local_b8,this,&tstruct->super_t_type,false,false,false,false);
          poVar5 = std::operator<<(poVar5,(string *)&local_b8);
          poVar5 = std::operator<<(poVar5,"();");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_e0);
          poVar3 = t_generator::indent((t_generator *)this,poVar3);
          poVar3 = std::operator<<(poVar3,"  x.set");
          std::__cxx11::string::string((string *)&local_90,(string *)&(*pptVar7)->name_);
          get_cap_name(&local_e0,this,&local_90);
          std::operator<<(poVar3,(string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_90);
          poVar3 = local_c0;
          pcVar6 = "(java.nio.ByteBuffer.wrap(value.clone()));";
          if (this->unsafe_binaries_ != false) {
            pcVar6 = "(java.nio.ByteBuffer.wrap(value));";
          }
          poVar5 = t_generator::indent((t_generator *)this,local_c0);
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          poVar5 = t_generator::indent((t_generator *)this,poVar3);
          poVar5 = std::operator<<(poVar5,"  return x;");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          poVar3 = t_generator::indent((t_generator *)this,poVar3);
          poVar3 = std::operator<<(poVar3,"}");
          poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        }
      }
      return;
    }
    ptVar4 = t_type::get_true_type((*pptVar7)->type_);
    if ((*pptVar7)->value_ != (t_const_value *)0x0) {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"super(_Fields.");
      this_00 = (t_java_generator *)&(*pptVar7)->name_;
      std::__cxx11::string::string((string *)&local_50,(string *)this_00);
      constant_name(&local_e0,this_00,&local_50);
      poVar3 = std::operator<<(poVar3,(string *)&local_e0);
      poVar3 = std::operator<<(poVar3,", ");
      render_const_value_abi_cxx11_(&local_b8,this,out,ptVar4,(*pptVar7)->value_);
      poVar3 = std::operator<<(poVar3,(string *)&local_b8);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_001f990d;
    }
    pptVar7 = pptVar7 + 1;
  } while( true );
}

Assistant:

void t_java_generator::generate_union_constructor(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  indent(out) << "public " << type_name(tstruct) << "() {" << endl;
  indent_up();
  bool default_value = false;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* type = get_true_type((*m_iter)->get_type());
    if ((*m_iter)->get_value() != nullptr) {
      indent(out) << "super(_Fields." << constant_name((*m_iter)->get_name()) << ", "
                  << render_const_value(out, type, (*m_iter)->get_value()) << ");" << endl;
      default_value = true;
      break;
    }
  }
  if (default_value == false) {
    indent(out) << "super();" << endl;
  }
  indent_down();
  indent(out) << "}" << endl << endl;

  indent(out) << "public " << type_name(tstruct) << "(_Fields setField, java.lang.Object value) {" << endl;
  indent(out) << "  super(setField, value);" << endl;
  indent(out) << "}" << endl << endl;

  indent(out) << "public " << type_name(tstruct) << "(" << type_name(tstruct) << " other) {"
              << endl;
  indent(out) << "  super(other);" << endl;
  indent(out) << "}" << endl;

  indent(out) << "public " << tstruct->get_name() << " deepCopy() {" << endl;
  indent(out) << "  return new " << tstruct->get_name() << "(this);" << endl;
  indent(out) << "}" << endl << endl;

  // generate "constructors" for each field
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* type = (*m_iter)->get_type();
    indent(out) << "public static " << type_name(tstruct) << " " << (*m_iter)->get_name() << "("
                << type_name(type) << " value) {" << endl;
    indent(out) << "  " << type_name(tstruct) << " x = new " << type_name(tstruct) << "();" << endl;
    indent(out) << "  x.set" << get_cap_name((*m_iter)->get_name()) << "(value);" << endl;
    indent(out) << "  return x;" << endl;
    indent(out) << "}" << endl << endl;

    if (type->is_binary()) {
      indent(out) << "public static " << type_name(tstruct) << " " << (*m_iter)->get_name()
                  << "(byte[] value) {" << endl;
      indent(out) << "  " << type_name(tstruct) << " x = new " << type_name(tstruct) << "();"
                  << endl;
      indent(out) << "  x.set" << get_cap_name((*m_iter)->get_name());
      if(unsafe_binaries_) {
        indent(out) << "(java.nio.ByteBuffer.wrap(value));" << endl;
      }else{
        indent(out) << "(java.nio.ByteBuffer.wrap(value.clone()));" << endl;
      }
      indent(out) << "  return x;" << endl;
      indent(out) << "}" << endl << endl;
    }
  }
}